

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int arena_i_name_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                    size_t newlen)

{
  ulong uVar1;
  int iVar2;
  arena_t *arena;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar2 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  uVar1 = mib[1];
  iVar2 = 0xe;
  if (uVar1 >> 0x20 != 0) goto LAB_01c6c4cc;
  if ((uVar1 != 0x1000) && ((uint)uVar1 < ctl_arenas->narenas)) {
    arena = (arena_t *)duckdb_je_arenas[uVar1].repr;
    if (arena == (arena_t *)0x0) {
      arena = (arena_t *)0x0;
    }
    if (arena == (arena_t *)0x0) goto LAB_01c6c4cc;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      if (*oldlenp != 8) goto LAB_01c6c4c7;
      duckdb_je_arena_name_get(arena,*oldp);
    }
    iVar2 = 0;
    if (newp == (void *)0x0) goto LAB_01c6c4cc;
    if (newlen == 8) {
      iVar2 = 0x16;
      if (*newp != (char *)0x0) {
        duckdb_je_arena_name_set(arena,*newp);
        iVar2 = 0;
      }
      goto LAB_01c6c4cc;
    }
  }
LAB_01c6c4c7:
  iVar2 = 0x16;
LAB_01c6c4cc:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar2;
}

Assistant:

static int
arena_i_name_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;
	char *name;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	MIB_UNSIGNED(arena_ind, 1);
	if (arena_ind == MALLCTL_ARENAS_ALL || arena_ind >=
	    ctl_arenas->narenas) {
		ret = EINVAL;
		goto label_return;
	}
	arena_t *arena = arena_get(tsd_tsdn(tsd), arena_ind, false);
	if (arena == NULL) {
		ret = EFAULT;
		goto label_return;
	}

	if (oldp != NULL && oldlenp != NULL) {
		/*
		 * Read the arena name.  When reading, the input oldp should
		 * point to an array with a length no shorter than
		 * ARENA_NAME_LEN or the length when it was set.
		 */
		if (*oldlenp != sizeof(char *)) {
			ret = EINVAL;
			goto label_return;
		}
		name = *(char **)oldp;
		arena_name_get(arena, name);
	}

	if (newp != NULL) {
		/* Write the arena name. */
		WRITE(name, char *);
		if (name == NULL) {
			ret = EINVAL;
			goto label_return;
		}
		arena_name_set(arena, name);
	}
	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}